

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InstrumentPass::GenUintCastCode
          (InstrumentPass *this,uint32_t val_id,InstructionBuilder *builder)

{
  IRContext *this_00;
  TypeManager *this_01;
  uint32_t uVar1;
  Analysis AVar2;
  uint32_t uVar3;
  int iVar4;
  Instruction *pIVar5;
  Type *pTVar6;
  undefined4 extraout_var;
  IRContext *this_02;
  
  uVar1 = Gen32BitCvtCode(this,val_id,builder);
  this_00 = (this->super_Pass).context_;
  AVar2 = this_00->valid_analyses_;
  this_02 = this_00;
  if (-1 < (short)AVar2) {
    IRContext::BuildTypeManager(this_00);
    this_02 = (this->super_Pass).context_;
    AVar2 = this_02->valid_analyses_;
  }
  this_01 = (this_00->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  if ((AVar2 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_02);
  }
  pIVar5 = analysis::DefUseManager::GetDef
                     ((this_02->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar1);
  uVar3 = 0;
  if (pIVar5->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(pIVar5,0);
  }
  pTVar6 = analysis::TypeManager::GetType(this_01,uVar3);
  iVar4 = (*pTVar6->_vptr_Type[9])(pTVar6);
  if (*(char *)(CONCAT44(extraout_var,iVar4) + 0x28) == '\x01') {
    uVar3 = GetUintId(this);
    pIVar5 = InstructionBuilder::AddUnaryOp(builder,uVar3,OpBitcast,uVar1);
    uVar1 = 0;
    if (pIVar5->has_result_id_ == true) {
      uVar1 = Instruction::GetSingleWordOperand(pIVar5,(uint)pIVar5->has_type_id_);
      return uVar1;
    }
  }
  return uVar1;
}

Assistant:

uint32_t InstrumentPass::GenUintCastCode(uint32_t val_id,
                                         InstructionBuilder* builder) {
  // Convert value to 32-bit if necessary
  uint32_t val_32b_id = Gen32BitCvtCode(val_id, builder);
  // Cast value to unsigned if necessary
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  uint32_t val_ty_id = get_def_use_mgr()->GetDef(val_32b_id)->type_id();
  analysis::Integer* val_ty = type_mgr->GetType(val_ty_id)->AsInteger();
  if (!val_ty->IsSigned()) return val_32b_id;
  return builder->AddUnaryOp(GetUintId(), spv::Op::OpBitcast, val_32b_id)
      ->result_id();
}